

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::MediumInterface
          (ParsedScene *this,string *insideName,string *outsideName,FileLoc loc)

{
  string local_30;
  
  if (this->currentApiState == Uninitialized) {
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    detail::stringPrintfRecursive<char_const(&)[16]>
              (&local_30,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"MediumInterface");
    Error(&loc,local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                               local_30.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__cxx11::string::_M_assign((string *)this->graphicsState);
  std::__cxx11::string::_M_assign((string *)&this->graphicsState->currentOutsideMedium);
  return;
}

Assistant:

void ParsedScene::MediumInterface(const std::string &insideName,
                                  const std::string &outsideName, FileLoc loc) {
    VERIFY_INITIALIZED("MediumInterface");
    graphicsState->currentInsideMedium = insideName;
    graphicsState->currentOutsideMedium = outsideName;
}